

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodes.c
# Opt level: O3

void sbc_E5(void)

{
  byte bVar1;
  
  except = '\0';
  bVar1 = getbyte(pc);
  temp1 = RAM[bVar1];
  _AL = acc;
  _AH = RAM[bVar1];
  ovr_f = '\0';
  carry_f = '\x01';
  pc = pc + 1;
  return;
}

Assistant:

void sbc_E5(void) {
    uint flags;
    uint answer;

    CLE;
    temp1 = RAM[getbyte(pc)];

    asm("push ax");

    asm("CLC");
    if (!carry_f) asm("STC");

    _AL = acc;
    _AH = temp1;

    asm("sbb AL,AH");
    asm("pushf");
    asm("pop flags");
    asm("push AX");
    asm("pop answer");
    asm("pop AX");

    result_f = acc = answer;
    (flags & 0x800) ? (ovr_f = 1) : (ovr_f = 0);
    carry_f = (flags & 1) ^ 1;

    pc++;
}